

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

Options * __thiscall
ApprovalTests::Options::FileOptions::withFileExtension
          (Options *__return_storage_ptr__,FileOptions *this,string *fileExtensionWithDot)

{
  int in_ECX;
  void *in_R8;
  FileOptions newSelf;
  undefined1 auStack_68 [40];
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)fileExtensionWithDot);
  FileOptions((FileOptions *)auStack_68,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  Options::clone(__return_storage_ptr__,(__fn *)this->options_,auStack_68,in_ECX,in_R8);
  ::std::__cxx11::string::~string((string *)(auStack_68 + 8));
  return __return_storage_ptr__;
}

Assistant:

Options
    Options::FileOptions::withFileExtension(const std::string& fileExtensionWithDot) const
    {
        FileOptions newSelf(fileExtensionWithDot);
        return options_->clone(newSelf);
    }